

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer.cc
# Opt level: O0

Status __thiscall
sentencepiece::normalizer::Normalizer::Normalize
          (Normalizer *this,string_view input,string *normalized,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *norm_to_orig)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  string_view expected;
  basic_string_view<char,_std::char_traits<char>_> __x;
  string_view suffix;
  string_view suffix_00;
  string_view text;
  string_view text_00;
  ulong uVar1;
  string *psVar2;
  bool bVar3;
  int iVar4;
  size_type sVar5;
  const_pointer pvVar6;
  StatusBuilder *this_00;
  reference pvVar7;
  long lVar8;
  char *in_RCX;
  size_t in_RDX;
  long *in_RSI;
  unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
  in_RDI;
  string *in_R8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_R9;
  int length;
  string_view space;
  size_t m;
  size_t n;
  char *data;
  string_view sp;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_int> p_1;
  bool is_prev_space;
  anon_class_40_5_a21b5dae add_ws;
  string_view kSpaceSymbol;
  size_t kReservedSize;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_int> p;
  int consumed;
  Status *_status;
  undefined4 in_stack_fffffffffffffa78;
  StatusCode in_stack_fffffffffffffa7c;
  StatusBuilder *in_stack_fffffffffffffa80;
  char *in_stack_fffffffffffffa88;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffa90;
  string_view *in_stack_fffffffffffffa98;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffaa0;
  char *in_stack_fffffffffffffaa8;
  anon_class_40_5_a21b5dae *in_stack_fffffffffffffab0;
  size_t in_stack_fffffffffffffab8;
  char *in_stack_fffffffffffffac0;
  StatusBuilder *in_stack_fffffffffffffac8;
  bool local_4da;
  Normalizer *in_stack_fffffffffffffd50;
  string_view in_stack_fffffffffffffd58;
  basic_string_view<char,_std::char_traits<char>_> local_180 [2];
  size_t local_160;
  char *local_158;
  long local_150;
  long local_148;
  ulong local_140;
  ulong local_138;
  const_pointer local_130;
  basic_string_view<char,_std::char_traits<char>_> local_118;
  size_t local_108;
  char *local_100;
  size_t local_f8;
  char *local_f0;
  int local_e8;
  byte local_d9;
  int *local_d0;
  string **local_c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> **local_c0;
  basic_string_view<char,_std::char_traits<char>_> *local_b8;
  basic_string_view<char,_std::char_traits<char>_> local_b0;
  long local_a0;
  undefined8 local_88;
  undefined8 local_80;
  size_t local_78;
  char *local_70;
  undefined8 local_68;
  undefined8 local_60;
  int local_58;
  int local_4c;
  uint local_48;
  byte local_31;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_30;
  string *local_28 [2];
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  local_30 = in_R9;
  local_28[0] = in_R8;
  local_18._M_len = in_RDX;
  local_18._M_str = in_RCX;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x475007);
  std::__cxx11::string::clear();
  bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18);
  if (bVar3) {
    util::OkStatus();
  }
  else {
    local_31 = 0;
    (**(code **)(*in_RSI + 0x18))
              (in_RDI._M_t.
               super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
               ._M_t.
               super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
               .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl);
    bVar3 = util::Status::ok((Status *)0x475069);
    if (!bVar3) {
      local_31 = 1;
    }
    local_48 = (uint)!bVar3;
    if ((local_31 & 1) == 0) {
      util::Status::~Status((Status *)0x4750dc);
    }
    if (local_48 == 0) {
      local_4c = 0;
      bVar3 = NormalizerSpec::remove_extra_whitespaces((NormalizerSpec *)0x47510c);
      if (bVar3) {
        while (bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18),
              ((bVar3 ^ 0xffU) & 1) != 0) {
          local_78 = local_18._M_len;
          local_70 = local_18._M_str;
          NormalizePrefix(in_stack_fffffffffffffd50,in_stack_fffffffffffffd58);
          local_88 = local_68;
          local_80 = local_60;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
          __x._M_str = (char *)in_stack_fffffffffffffab0;
          __x._M_len = (size_t)in_stack_fffffffffffffaa8;
          __y._M_str = (char *)in_stack_fffffffffffffaa0;
          __y._M_len = (size_t)in_stack_fffffffffffffa98;
          bVar3 = std::operator!=(__x,__y);
          if (bVar3) break;
          std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                    (&local_18,(long)local_58);
          local_4c = local_58 + local_4c;
        }
      }
      bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18);
      if (bVar3) {
        util::OkStatus();
      }
      else {
        sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_18);
        local_a0 = sVar5 * 3;
        std::__cxx11::string::reserve((ulong)local_28[0]);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffffab0,(size_type)in_stack_fffffffffffffaa8);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
        local_d0 = &local_4c;
        local_c8 = local_28;
        local_c0 = &local_30;
        local_b8 = &local_b0;
        if (((*(byte *)(in_RSI + 5) & 1) == 0) &&
           (bVar3 = NormalizerSpec::add_dummy_prefix((NormalizerSpec *)0x4752e9), bVar3)) {
          Normalize::anon_class_40_5_a21b5dae::operator()(in_stack_fffffffffffffab0);
        }
        local_d9 = NormalizerSpec::remove_extra_whitespaces((NormalizerSpec *)0x47530d);
        while (bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18),
              ((bVar3 ^ 0xffU) & 1) != 0) {
          local_108 = local_18._M_len;
          local_100 = local_18._M_str;
          NormalizePrefix(in_stack_fffffffffffffd50,in_stack_fffffffffffffd58);
          local_118._M_len = local_f8;
          local_118._M_str = local_f0;
          do {
            local_4da = false;
            if ((local_d9 & 1) != 0) {
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
              expected._M_str = in_stack_fffffffffffffaa8;
              expected._M_len = (size_t)in_stack_fffffffffffffaa0;
              local_4da = absl::ConsumePrefix(in_stack_fffffffffffffa98,expected);
            }
          } while (local_4da != false);
          bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_118);
          if (!bVar3) {
            local_130 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_118);
            for (local_138 = 0; uVar1 = local_138,
                sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_118),
                uVar1 < sVar5; local_138 = local_138 + 1) {
              bVar3 = NormalizerSpec::escape_whitespaces((NormalizerSpec *)0x475465);
              psVar2 = local_28[0];
              if ((bVar3) && (local_130[local_138] == ' ')) {
                pvVar6 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_b0);
                std::basic_string_view<char,_std::char_traits<char>_>::size(&local_b0);
                std::__cxx11::string::append((char *)psVar2,(ulong)pvVar6);
                for (local_140 = 0; uVar1 = local_140,
                    sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_b0),
                    uVar1 < sVar5; local_140 = local_140 + 1) {
                  local_148 = (long)local_4c;
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             in_stack_fffffffffffffa80,
                             (value_type_conflict2 *)
                             CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
                }
              }
              else {
                std::__cxx11::string::operator+=(local_28[0],local_130[local_138]);
                local_150 = (long)local_4c;
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           in_stack_fffffffffffffa80,
                           (value_type_conflict2 *)
                           CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
              }
            }
            local_160 = local_118._M_len;
            local_158 = local_118._M_str;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
            text._M_str = in_stack_fffffffffffffac0;
            text._M_len = in_stack_fffffffffffffab8;
            suffix._M_str = (char *)in_stack_fffffffffffffab0;
            suffix._M_len = (size_t)in_stack_fffffffffffffaa8;
            local_d9 = absl::EndsWith(text,suffix);
          }
          local_4c = local_e8 + local_4c;
          std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                    (&local_18,(long)local_e8);
          bVar3 = NormalizerSpec::remove_extra_whitespaces((NormalizerSpec *)0x47564b);
          if (!bVar3) {
            local_d9 = 0;
          }
        }
        bVar3 = NormalizerSpec::remove_extra_whitespaces((NormalizerSpec *)0x47566d);
        if (bVar3) {
          bVar3 = NormalizerSpec::escape_whitespaces((NormalizerSpec *)0x475687);
          if (bVar3) {
            local_180[0]._M_len = local_b0._M_len;
            local_180[0]._M_str = local_b0._M_str;
          }
          else {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
          }
          while( true ) {
            std::__cxx11::string::operator_cast_to_basic_string_view(local_28[0]);
            text_00._M_str = in_stack_fffffffffffffac0;
            text_00._M_len = in_stack_fffffffffffffab8;
            suffix_00._M_str = (char *)in_stack_fffffffffffffab0;
            suffix_00._M_len = (size_t)in_stack_fffffffffffffaa8;
            bVar3 = absl::EndsWith(text_00,suffix_00);
            if (!bVar3) break;
            iVar4 = std::__cxx11::string::size();
            sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size(local_180);
            iVar4 = iVar4 - (int)sVar5;
            if (iVar4 < 0) {
              util::StatusBuilder::StatusBuilder
                        (in_stack_fffffffffffffa80,in_stack_fffffffffffffa7c);
              util::StatusBuilder::operator<<
                        (in_stack_fffffffffffffa80,
                         (char (*) [44])
                         CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
              util::StatusBuilder::operator<<
                        (in_stack_fffffffffffffa80,
                         (char (*) [2])CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78)
                        );
              util::StatusBuilder::operator<<
                        (in_stack_fffffffffffffa80,
                         (int *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
              util::StatusBuilder::operator<<
                        (in_stack_fffffffffffffa80,
                         (char (*) [4])CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78)
                        );
              this_00 = util::StatusBuilder::operator<<
                                  (in_stack_fffffffffffffa80,
                                   (char (*) [16])
                                   CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
              util::StatusBuilder::operator<<
                        (in_stack_fffffffffffffa80,
                         (char (*) [3])CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78)
                        );
              util::StatusBuilder::operator_cast_to_Status(this_00);
              util::StatusBuilder::~StatusBuilder((StatusBuilder *)0x47584a);
              return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                      )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                        )in_RDI._M_t.
                         super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                         .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>.
                         _M_head_impl;
            }
            pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (local_30,(long)iVar4);
            local_4c = (int)*pvVar7;
            std::__cxx11::string::resize((ulong)local_28[0]);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                      (in_stack_fffffffffffffaa0,(size_type)in_stack_fffffffffffffa98);
          }
        }
        if (((*(byte *)(in_RSI + 5) & 1) != 0) &&
           (bVar3 = NormalizerSpec::add_dummy_prefix((NormalizerSpec *)0x4758e4), bVar3)) {
          Normalize::anon_class_40_5_a21b5dae::operator()(in_stack_fffffffffffffab0);
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffffa80,
                   (value_type_conflict2 *)
                   CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
        sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_30);
        lVar8 = std::__cxx11::string::size();
        if (sVar5 == lVar8 + 1U) {
          util::OkStatus();
        }
        else {
          util::StatusBuilder::StatusBuilder(in_stack_fffffffffffffa80,in_stack_fffffffffffffa7c);
          util::StatusBuilder::operator<<
                    (in_stack_fffffffffffffa80,
                     (char (*) [44])CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
          util::StatusBuilder::operator<<
                    (in_stack_fffffffffffffa80,
                     (char (*) [2])CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
          util::StatusBuilder::operator<<
                    (in_stack_fffffffffffffa80,
                     (int *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
          util::StatusBuilder::operator<<
                    (in_stack_fffffffffffffa80,
                     (char (*) [4])CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
          util::StatusBuilder::operator<<
                    (in_stack_fffffffffffffa80,
                     (char (*) [51])CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
          util::StatusBuilder::operator<<
                    (in_stack_fffffffffffffa80,
                     (char (*) [3])CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
          util::StatusBuilder::operator_cast_to_Status(in_stack_fffffffffffffac8);
          util::StatusBuilder::~StatusBuilder((StatusBuilder *)0x475a25);
        }
      }
    }
  }
  return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
          )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
            )in_RDI._M_t.
             super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
             ._M_t.
             super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
             .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl;
}

Assistant:

util::Status Normalizer::Normalize(absl::string_view input,
                                   std::string *normalized,
                                   std::vector<size_t> *norm_to_orig) const {
  norm_to_orig->clear();
  normalized->clear();

  if (input.empty()) {
    return util::OkStatus();
  }

  RETURN_IF_ERROR(status());

  int consumed = 0;

  // Ignores heading space.
  if (spec_->remove_extra_whitespaces()) {
    while (!input.empty()) {
      const auto p = NormalizePrefix(input);
      if (p.first != " ") {
        break;
      }
      input.remove_prefix(p.second);
      consumed += p.second;
    }
  }

  // all chars are whitespace.
  if (input.empty()) {
    return util::OkStatus();
  }

  // Reserves the output buffer to avoid re-allocations.
  const size_t kReservedSize = input.size() * 3;
  normalized->reserve(kReservedSize);
  norm_to_orig->reserve(kReservedSize);

  // Replaces white space with U+2581 (LOWER ONE EIGHT BLOCK)
  // if escape_whitespaces() is set (default = true).
  const absl::string_view kSpaceSymbol = "\xe2\x96\x81";

  // adds kSpaceSymbol to the current context.
  auto add_ws = [this, &consumed, &normalized, &norm_to_orig, &kSpaceSymbol]() {
    if (spec_->escape_whitespaces()) {
      normalized->append(kSpaceSymbol.data(), kSpaceSymbol.size());
      for (size_t n = 0; n < kSpaceSymbol.size(); ++n) {
        norm_to_orig->push_back(consumed);
      }
    } else {
      normalized->append(" ");
      norm_to_orig->push_back(consumed);
    }
  };

  // Adds a space symbol as a prefix (default is true)
  // With this prefix, "world" and "hello world" are converted into
  // "_world" and "_hello_world", which help the trainer to extract
  // "_world" as one symbol.
  if (!treat_whitespace_as_suffix_ && spec_->add_dummy_prefix()) add_ws();

  bool is_prev_space = spec_->remove_extra_whitespaces();
  while (!input.empty()) {
    auto p = NormalizePrefix(input);
    absl::string_view sp = p.first;

    // Removes heading spaces in sentence piece,
    // if the previous sentence piece ends with whitespace.
    while (is_prev_space && absl::ConsumePrefix(&sp, " ")) {
    }

    if (!sp.empty()) {
      const char *data = sp.data();
      for (size_t n = 0; n < sp.size(); ++n) {
        if (spec_->escape_whitespaces() && data[n] == ' ') {
          // replace ' ' with kSpaceSymbol.
          normalized->append(kSpaceSymbol.data(), kSpaceSymbol.size());
          for (size_t m = 0; m < kSpaceSymbol.size(); ++m) {
            norm_to_orig->push_back(consumed);
          }
        } else {
          *normalized += data[n];
          norm_to_orig->push_back(consumed);
        }
      }
      // Checks whether the last character of sp is whitespace.
      is_prev_space = absl::EndsWith(sp, " ");
    }

    consumed += p.second;
    input.remove_prefix(p.second);
    if (!spec_->remove_extra_whitespaces()) {
      is_prev_space = false;
    }
  }

  // Ignores trailing space.
  if (spec_->remove_extra_whitespaces()) {
    const absl::string_view space =
        spec_->escape_whitespaces() ? kSpaceSymbol : " ";
    while (absl::EndsWith(*normalized, space)) {
      const int length = normalized->size() - space.size();
      CHECK_GE_OR_RETURN(length, 0);
      consumed = (*norm_to_orig)[length];
      normalized->resize(length);
      norm_to_orig->resize(length);
    }
  }

  // Adds a space symbol as a suffix (default is false)
  if (treat_whitespace_as_suffix_ && spec_->add_dummy_prefix()) add_ws();

  norm_to_orig->push_back(consumed);

  CHECK_EQ_OR_RETURN(norm_to_orig->size(), normalized->size() + 1);

  return util::OkStatus();
}